

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::Execute(Parser *this)

{
  element_type *this_00;
  char *val;
  undefined1 local_1c [8];
  BytecodeHeader header;
  Parser *this_local;
  
  header._4_8_ = this;
  this_00 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_bytecode);
  Buffer::Reserve(this_00,0x400);
  BytecodeHeader::BytecodeHeader((BytecodeHeader *)local_1c);
  BinaryWriter::Write(&this->m_writer,local_1c,0xc);
  val = std::__cxx11::
        basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_8192UL,_16UL>_>::
        c_str(&this->m_name);
  BinaryWriter::Write(&this->m_writer,val);
  ParseScript(this);
  return (bool)((this->m_error ^ 0xffU) & 1);
}

Assistant:

inline_t bool Parser::Execute()
	{
		// Reserve 1K space
		m_bytecode->Reserve(1024);

		// Write bytecode header
		BytecodeHeader header;
		m_writer.Write(&header, sizeof(header));

		// Write script name
		m_writer.Write(m_name.c_str());

		// Parse script symbols into bytecode
		ParseScript();

		// Return error status
		return !m_error;
	}